

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

int64_t mp_decode_int(char **data)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)*data;
  bVar1 = *pbVar5;
  *data = (char *)(pbVar5 + 1);
  switch(bVar1) {
  case 0xd0:
    uVar4 = (ulong)(char)pbVar5[1];
    pbVar5 = pbVar5 + 2;
    break;
  case 0xd1:
    uVar2 = *(ushort *)(pbVar5 + 1);
    *data = (char *)(pbVar5 + 3);
    return (long)(short)(uVar2 << 8 | uVar2 >> 8);
  case 0xd2:
    uVar3 = *(uint *)(pbVar5 + 1);
    *data = (char *)(pbVar5 + 5);
    return (long)(int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18);
  case 0xd3:
    uVar4 = *(ulong *)(pbVar5 + 1);
    uVar4 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
            (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
            (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    pbVar5 = pbVar5 + 9;
    break;
  default:
    if (bVar1 < 0xe0) {
      mp_decode_int_cold_1();
      return 5;
    }
    return (long)(char)bVar1;
  }
  *data = (char *)pbVar5;
  return uVar4;
}

Assistant:

MP_IMPL int64_t
mp_decode_int(const char **data)
{
	uint8_t c = mp_load_u8(data);
	switch (c) {
	case 0xd0:
		return (int8_t) mp_load_u8(data);
	case 0xd1:
		return (int16_t) mp_load_u16(data);
	case 0xd2:
		return (int32_t) mp_load_u32(data);
	case 0xd3:
		return (int64_t) mp_load_u64(data);
	default:
		if (mp_unlikely(c < 0xe0))
			mp_unreachable();
		return (int8_t) (c);
	}
}